

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O0

void helics::loadOptions<toml::basic_value<toml::type_config>,helics::Input>
               (ValueFederate *fed,basic_value<toml::type_config> *data,Input *objUpdate)

{
  string_view info_00;
  string_view defVal;
  bool bVar1;
  Input *in_RDX;
  string *in_RSI;
  value *in_RDI;
  value *unaff_retaddr;
  string info;
  double tol;
  string *in_stack_fffffffffffffd48;
  value *in_stack_fffffffffffffd50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  anon_class_16_2_5e8ce78e *in_stack_fffffffffffffd58;
  Interface *in_stack_fffffffffffffd60;
  Input *pIVar2;
  string *key;
  function<void_(int,_int)> *in_stack_fffffffffffffd78;
  value *pvVar3;
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_fffffffffffffd80;
  allocator<char> *__a;
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_fffffffffffffd88;
  string *__s;
  value *in_stack_fffffffffffffd90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_211;
  Input *local_1f0;
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  local_1e8;
  __sv_type local_1c8;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined1 local_1a1 [72];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_159;
  undefined8 local_138;
  Input *local_130;
  allocator<char> local_f9 [33];
  Input *local_d8;
  string *in_stack_ffffffffffffff78;
  value *in_stack_ffffffffffffff80;
  anon_class_16_2_5e8ce78e in_stack_ffffffffffffff88;
  Input *targetName;
  anon_class_8_1_a2318340 in_stack_ffffffffffffffb0;
  allocator<char> local_39 [33];
  Input *local_18;
  string *local_10;
  value *tagAction;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88,
             (allocator<char> *)in_stack_fffffffffffffd80);
  targetName = local_18;
  tagAction = in_RDI;
  addTargets<helics::loadOptions<toml::basic_value<toml::type_config>,helics::Input>(helics::ValueFederate*,toml::basic_value<toml::type_config>const&,helics::Input&)::_lambda(std::__cxx11::string_const&)_1_>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff88);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd50);
  std::allocator<char>::~allocator(local_39);
  std::function<int(std::__cxx11::string_const&)>::
  function<helics::loadOptions<toml::basic_value<toml::type_config>,helics::Input>(helics::ValueFederate*,toml::basic_value<toml::type_config>const&,helics::Input&)::_lambda(std::__cxx11::string_const&)_2_,void>
            ((function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_fffffffffffffd60,(anon_class_1_0_00000001 *)in_stack_fffffffffffffd58);
  std::function<int(std::__cxx11::string_const&)>::
  function<helics::loadOptions<toml::basic_value<toml::type_config>,helics::Input>(helics::ValueFederate*,toml::basic_value<toml::type_config>const&,helics::Input&)::_lambda(std::__cxx11::string_const&)_3_,void>
            ((function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_fffffffffffffd60,(anon_class_1_0_00000001 *)in_stack_fffffffffffffd58);
  local_d8 = local_18;
  std::function<void(int,int)>::
  function<helics::loadOptions<toml::basic_value<toml::type_config>,helics::Input>(helics::ValueFederate*,toml::basic_value<toml::type_config>const&,helics::Input&)::_lambda(int,int)_1_,void>
            ((function<void_(int,_int)> *)in_stack_fffffffffffffd60,
             (anon_class_8_1_a2318340 *)in_stack_fffffffffffffd58);
  processOptions(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                 in_stack_fffffffffffffd78);
  std::function<void_(int,_int)>::~function((function<void_(int,_int)> *)0x28cecc);
  std::
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x28ced9);
  std::
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x28cee6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88,
             (allocator<char> *)in_stack_fffffffffffffd80);
  local_130 = local_18;
  pvVar3 = (value *)&stack0xfffffffffffffee0;
  std::function<void(std::__cxx11::string_const&)>::
  function<helics::loadOptions<toml::basic_value<toml::type_config>,helics::Input>(helics::ValueFederate*,toml::basic_value<toml::type_config>const&,helics::Input&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_1_,void>
            ((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  fileops::callIfMember
            (pvVar3,(string *)in_stack_fffffffffffffd90,
             (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_fffffffffffffd88);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x28cf80);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd50);
  std::allocator<char>::~allocator(local_f9);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1a1 + 0x48);
  __s = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)__s,(allocator<char> *)in_stack_fffffffffffffd80);
  __a = (allocator<char> *)
        fileops::getOrDefault
                  (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,1.32146256096221e-317);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd50);
  std::allocator<char>::~allocator((allocator<char> *)(local_1a1 + 0x48));
  local_138 = __a;
  if (0.0 < (double)__a) {
    Input::setMinimumChange(local_18,(double)__a);
  }
  pvVar3 = (value *)local_1a1;
  key = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  local_1b8 = 0;
  uStack_1b0 = 0;
  defVal._M_str = (char *)__s;
  defVal._M_len = (size_t)__a;
  fileops::getOrDefault(pvVar3,key,defVal);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd50);
  std::allocator<char>::~allocator((allocator<char> *)local_1a1);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x28d210);
  if (!bVar1) {
    pIVar2 = local_18;
    local_1c8 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffd50);
    info_00._M_str = (char *)key;
    info_00._M_len = (size_t)pIVar2;
    Interface::setInfo(in_stack_fffffffffffffd60,info_00);
  }
  local_1f0 = local_18;
  std::
  function<void(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>
  ::
  function<helics::loadOptions<toml::basic_value<toml::type_config>,helics::Input>(helics::ValueFederate*,toml::basic_value<toml::type_config>const&,helics::Input&)::_lambda(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)_1_,void>
            (&local_1e8,(anon_class_8_1_a2318340 *)local_10);
  loadTags(unaff_retaddr,
           (function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
            *)tagAction);
  std::
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
               *)0x28d317);
  this = &local_211;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  addTargets<helics::loadOptions<toml::basic_value<toml::type_config>,helics::Input>(helics::ValueFederate*,toml::basic_value<toml::type_config>const&,helics::Input&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_2_>
            (in_RDI,(string *)targetName,in_stack_ffffffffffffffb0);
  std::__cxx11::string::~string(this);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  std::__cxx11::string::~string(this);
  return;
}

Assistant:

static void loadOptions(ValueFederate* fed, const Inp& data, Obj& objUpdate)
{
    using fileops::getOrDefault;

    addTargets(data, "flags", [&objUpdate, fed](const std::string& target) {
        auto oindex = getOptionIndex((target.front() != '-') ? target : target.substr(1));
        const int val = (target.front() != '-') ? 1 : 0;
        if (oindex == HELICS_INVALID_OPTION_INDEX) {
            fed->logWarningMessage(target + " is not a valid flag");
            return;
        }
        objUpdate.setOption(oindex, val);
    });
    processOptions(
        data,
        [](const std::string& option) { return getOptionIndex(option); },
        [](const std::string& value) { return getOptionValue(value); },
        [&objUpdate](int32_t option, int32_t value) { objUpdate.setOption(option, value); });

    fileops::callIfMember(data, "alias", [&objUpdate, fed](std::string_view val) {
        fed->addAlias(objUpdate, val);
    });

    auto tol = getOrDefault(data, "tolerance", -1.0);
    if (tol > 0.0) {
        objUpdate.setMinimumChange(tol);
    }
    auto info = getOrDefault(data, "info", emptyStr);
    if (!info.empty()) {
        objUpdate.setInfo(info);
    }
    loadTags(data, [&objUpdate](std::string_view tagname, std::string_view tagvalue) {
        objUpdate.setTag(tagname, tagvalue);
    });
    addTargets(data, "targets", [&objUpdate](std::string_view target) {
        objUpdate.addTarget(target);
    });
}